

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::
ParameterizedTestFactory<datarate_test::(anonymous_namespace)::DatarateTestLarge_BasicRateTargetingSuperresCBR_Test>
::CreateTest(ParameterizedTestFactory<datarate_test::(anonymous_namespace)::DatarateTestLarge_BasicRateTargetingSuperresCBR_Test>
             *this)

{
  DatarateTestLarge *this_00;
  
  WithParamInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,int,unsigned_int,int>>
  ::parameter_ = &this->parameter_;
  this_00 = (DatarateTestLarge *)operator_new(0x4d0);
  datarate_test::anon_unknown_0::DatarateTestLarge::DatarateTestLarge(this_00);
  (this_00->super_CodecTestWith4Params<libaom_test::TestMode,_int,_unsigned_int,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__DatarateTestLarge_0102da18;
  (this_00->super_CodecTestWith4Params<libaom_test::TestMode,_int,_unsigned_int,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  .
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  ._vptr_WithParamInterface =
       (_func_int **)&PTR__DatarateTestLarge_BasicRateTargetingSuperresCBR_Test_0102dac0;
  (this_00->super_DatarateTest).super_EncoderTest._vptr_EncoderTest =
       (_func_int **)&PTR__DatarateTestLarge_BasicRateTargetingSuperresCBR_Test_0102dae0;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }